

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_crease(REF_GRID ref_grid,REF_INT node,REF_DBL *dot_prod)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  REF_INT RVar9;
  double dVar10;
  double dVar11;
  REF_DBL uv [2];
  REF_DBL area_sign1;
  REF_DBL area_sign0;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  REF_DBL local_178 [2];
  ulong local_168;
  ulong local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_108;
  double local_100;
  double local_f8;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  *dot_prod = 1.0;
  if (((-1 < node) && (node < pRVar2->max)) &&
     (local_160 = (ulong)(uint)node, -1 < pRVar2->global[local_160])) {
    pRVar4 = pRVar3->ref_adj;
    uVar7 = 0xffffffff;
    if (node < pRVar4->nnode) {
      uVar7 = (ulong)(uint)pRVar4->first[local_160];
    }
    if ((int)uVar7 != -1) {
      RVar9 = pRVar4->item[(int)uVar7].ref;
      do {
        uVar6 = ref_cell_nodes(ref_grid->cell[3],RVar9,local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x701,"ref_geom_crease",(ulong)uVar6,"tri list for edge");
          return uVar6;
        }
        uVar6 = ref_geom_tri_centroid(ref_grid,local_a8,local_178);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x702,"ref_geom_crease",(ulong)uVar6,"tri cent");
          return uVar6;
        }
        RVar9 = local_a8[pRVar3->node_per];
        uVar6 = ref_geom_face_rsn(ref_grid->geom,RVar9,local_178,local_c8,local_e8,&local_108);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x704,"ref_geom_crease",(ulong)uVar6,"rsn");
          return uVar6;
        }
        uVar6 = ref_geom_uv_area_sign(ref_grid,RVar9,&local_130);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x705,"ref_geom_crease",(ulong)uVar6,"a sign");
          return uVar6;
        }
        pRVar4 = pRVar3->ref_adj;
        uVar8 = 0xffffffff;
        if (node < pRVar4->nnode) {
          uVar8 = (ulong)(uint)pRVar4->first[local_160];
        }
        local_168 = uVar7;
        if ((int)uVar8 != -1) {
          RVar9 = pRVar4->item[(int)uVar8].ref;
          local_140 = local_130;
          local_148 = local_108;
          local_150 = local_100;
          local_158 = local_f8;
          do {
            uVar6 = ref_cell_nodes(ref_grid->cell[3],RVar9,local_a8);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x708,"ref_geom_crease",(ulong)uVar6,"tri list for edge");
              return uVar6;
            }
            uVar6 = ref_geom_tri_centroid(ref_grid,local_a8,local_178);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x709,"ref_geom_crease",(ulong)uVar6,"tri cent");
              return uVar6;
            }
            RVar9 = local_a8[pRVar3->node_per];
            uVar6 = ref_geom_face_rsn(ref_grid->geom,RVar9,local_178,local_c8,local_e8,&local_128);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x70b,"ref_geom_crease",(ulong)uVar6,"rsn");
              return uVar6;
            }
            uVar6 = ref_geom_uv_area_sign(ref_grid,RVar9,&local_138);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x70c,"ref_geom_crease",(ulong)uVar6,"a sign");
              return uVar6;
            }
            dVar11 = (local_118 * local_158 + local_128 * local_148 + local_120 * local_150) *
                     local_138 * local_140;
            dVar10 = *dot_prod;
            if (dVar11 <= *dot_prod) {
              dVar10 = dVar11;
            }
            *dot_prod = dVar10;
            pRVar5 = pRVar3->ref_adj->item;
            iVar1 = pRVar5[(int)uVar8].next;
            uVar8 = (ulong)iVar1;
            if (uVar8 == 0xffffffffffffffff) {
              RVar9 = -1;
            }
            else {
              RVar9 = pRVar5[uVar8].ref;
            }
          } while (iVar1 != -1);
        }
        pRVar5 = pRVar3->ref_adj->item;
        iVar1 = pRVar5[(int)local_168].next;
        uVar7 = (ulong)iVar1;
        if (uVar7 == 0xffffffffffffffff) {
          RVar9 = -1;
        }
        else {
          RVar9 = pRVar5[uVar7].ref;
        }
      } while (iVar1 != -1);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_crease(REF_GRID ref_grid, REF_INT node,
                                   REF_DBL *dot_prod) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item0, item1, cell0, cell1, id;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL uv[2];
  REF_DBL r[3], s[3];
  REF_DBL n0[3], area_sign0;
  REF_DBL n1[3], area_sign1;

  *dot_prod = 1.0;

  if (!ref_node_valid(ref_node, node)) {
    return REF_SUCCESS;
  }

  each_ref_cell_having_node(ref_cell, node, item0, cell0) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell0, nodes),
        "tri list for edge");
    RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n0), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign0), "a sign");
    each_ref_cell_having_node(ref_cell, node, item1, cell1) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell1, nodes),
          "tri list for edge");
      RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
      id = nodes[ref_cell_node_per(ref_cell)];
      RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n1), "rsn");
      RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign1), "a sign");

      *dot_prod =
          MIN(*dot_prod, area_sign0 * area_sign1 * ref_math_dot(n0, n1));
    }
  }

  return REF_SUCCESS;
}